

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  uint uVar1;
  java *this_00;
  pointer pcVar2;
  java *pjVar3;
  string *psVar4;
  int iVar5;
  pointer this_01;
  long *plVar6;
  undefined8 *puVar7;
  LogMessage *pLVar8;
  pointer ppFVar9;
  long lVar10;
  mapped_type *pmVar11;
  java *pjVar12;
  long *plVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer ppFVar16;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar17;
  _Alloc_hider _Var18;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *extraout_RDX_13;
  FieldDescriptor *extraout_RDX_14;
  string *psVar19;
  FieldDescriptor *pFVar20;
  java *this_02;
  difference_type __n_1;
  string *psVar21;
  ulong uVar22;
  bool bVar23;
  vector<bool,_std::allocator<bool>_> local_258;
  string local_230;
  FieldDescriptor *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  ulong local_1c0;
  string local_190;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  ulong local_110;
  difference_type __n;
  size_type *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  string local_a0;
  undefined1 local_70 [8];
  FieldDescriptor *field;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_100 = (size_type *)((ulong)local_100 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_258,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_100,
             (allocator_type *)&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e8,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_100);
  ppFVar9 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar16 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pFVar17 = extraout_RDX;
  __n = (difference_type)fields;
  if (ppFVar16 != ppFVar9) {
    local_1c0 = 1;
    pFVar20 = (FieldDescriptor *)0x0;
    do {
      this_00 = (java *)ppFVar9[(long)pFVar20];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_230,this_00,pFVar17);
      local_210 = pFVar20 + 1;
      lVar10 = *(long *)__n;
      if (local_210 < (FieldDescriptor *)(*(long *)(__n + 8) - lVar10 >> 3)) {
        pFVar17 = (FieldDescriptor *)(1L << ((byte)pFVar20 & 0x3f));
        _Var18._M_p = (pointer)pFVar17;
        uVar22 = local_1c0;
        do {
          this_02 = *(java **)(lVar10 + uVar22 * 8);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_
                    (&local_190,this_02,(FieldDescriptor *)_Var18._M_p);
          local_110 = uVar22;
          if ((local_230._M_string_length == local_190._M_string_length) &&
             ((local_230._M_string_length == 0 ||
              (iVar5 = bcmp(local_230._M_dataplus._M_p,local_190._M_dataplus._M_p,
                            local_230._M_string_length), iVar5 == 0)))) {
            local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar22 >> 6 & 0x3ffffff] =
                 local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar22 >> 6 & 0x3ffffff] | 1L << ((byte)uVar22 & 0x3f);
            local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[(ulong)pFVar20 >> 6] =
                 local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(ulong)pFVar20 >> 6] | (ulong)pFVar17;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,"capitalized name of field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            this_00);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
            local_50 = &local_40;
            plVar13 = plVar6 + 2;
            if ((long *)*plVar6 == plVar13) {
              local_40 = *plVar13;
              lStack_38 = plVar6[3];
            }
            else {
              local_40 = *plVar13;
              local_50 = (long *)*plVar6;
            }
            local_48 = plVar6[1];
            *plVar6 = (long)plVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_50,**(ulong **)this_02);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar14 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_a0.field_2._M_allocated_capacity = *psVar14;
              local_a0.field_2._8_8_ = plVar6[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar14;
              local_a0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_a0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
            psVar14 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar14) {
              __str._M_string_length = *psVar14;
              __str.field_2._M_allocated_capacity = plVar6[3];
              local_100 = &__str._M_string_length;
            }
            else {
              __str._M_string_length = *psVar14;
              local_100 = (size_type *)*plVar6;
            }
            __str._M_dataplus._M_p = (pointer)plVar6[1];
            *plVar6 = (long)psVar14;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=
                      ((string *)((long)local_1e8 + local_110 * 0x20),(string *)&local_100);
            std::__cxx11::string::_M_assign((string *)((long)local_1e8 + pFVar20 * 0x20));
            _Var18._M_p = (pointer)extraout_RDX_00;
            if (local_100 != &__str._M_string_length) {
              operator_delete(local_100);
              _Var18._M_p = (pointer)extraout_RDX_01;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
              _Var18._M_p = (pointer)extraout_RDX_02;
            }
            if (local_50 != &local_40) {
              operator_delete(local_50);
              _Var18._M_p = (pointer)extraout_RDX_03;
            }
            if (local_70 != (undefined1  [8])&local_60) {
              operator_delete((void *)local_70);
              _Var18._M_p = (pointer)extraout_RDX_04;
            }
          }
          else {
            conflict_reason.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(uVar22 * 0x20);
            this_01 = (pointer)((long)local_1e8 + uVar22 * 0x20);
            bVar23 = *(int *)(this_00 + 0x3c) == 3;
            pjVar3 = this_00;
            psVar4 = &local_230;
            psVar21 = &local_190;
            do {
              psVar19 = psVar4;
              pjVar12 = pjVar3;
              uVar1 = *(uint *)(this_02 + 0x3c);
              _Var18._M_p = (pointer)(ulong)uVar1;
              if (bVar23) {
                if (uVar1 == 3) break;
                local_100 = &__str._M_string_length;
                pcVar2 = (psVar19->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_100,pcVar2,pcVar2 + psVar19->_M_string_length);
                std::__cxx11::string::append((char *)&local_100);
                psVar14 = local_100;
                if (__str._M_dataplus._M_p == (pointer)psVar21->_M_string_length) {
                  if (__str._M_dataplus._M_p == (pointer)0x0) {
                    bVar23 = true;
                  }
                  else {
                    iVar5 = bcmp(local_100,(psVar21->_M_dataplus)._M_p,
                                 (size_t)__str._M_dataplus._M_p);
                    bVar23 = iVar5 == 0;
                  }
                }
                else {
                  bVar23 = false;
                }
                if (psVar14 != &__str._M_string_length) {
                  operator_delete(psVar14);
                }
                if (bVar23) {
                  std::operator+(&local_208,"both repeated field \"",
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)pjVar12);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
                  local_130 = &local_120;
                  plVar13 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar13) {
                    local_120 = *plVar13;
                    lStack_118 = plVar6[3];
                  }
                  else {
                    local_120 = *plVar13;
                    local_130 = (long *)*plVar6;
                  }
                  local_128 = plVar6[1];
                  *plVar6 = (long)plVar13;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
                  local_150 = &local_140;
                  plVar13 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar13) {
                    local_140 = *plVar13;
                    lStack_138 = plVar6[3];
                  }
                  else {
                    local_140 = *plVar13;
                    local_150 = (long *)*plVar6;
                  }
                  local_148 = plVar6[1];
                  *plVar6 = (long)plVar13;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_150,**(ulong **)this_02);
                  local_170 = &local_160;
                  plVar13 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar13) {
                    local_160 = *plVar13;
                    lStack_158 = plVar6[3];
                  }
                  else {
                    local_160 = *plVar13;
                    local_170 = (long *)*plVar6;
                  }
                  local_168 = plVar6[1];
                  *plVar6 = (long)plVar13;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
                  local_70 = (undefined1  [8])&local_60;
                  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar6 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar6 == paVar15) {
                    local_60._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_60._8_8_ = plVar6[3];
                  }
                  else {
                    local_60._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_70 = (undefined1  [8])*plVar6;
                  }
                  field = (FieldDescriptor *)plVar6[1];
                  *plVar6 = (long)paVar15;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  puVar7 = (undefined8 *)std::__cxx11::string::append(local_70);
                  uVar22 = local_110;
                  local_50 = &local_40;
                  plVar6 = puVar7 + 2;
                  if ((long *)*puVar7 == plVar6) {
                    local_40 = *plVar6;
                    lStack_38 = puVar7[3];
                  }
                  else {
                    local_40 = *plVar6;
                    local_50 = (long *)*puVar7;
                  }
                  local_48 = puVar7[1];
                  *puVar7 = plVar6;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_50,(ulong)(psVar19->_M_dataplus)._M_p);
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  psVar14 = puVar7 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar14) {
                    local_a0.field_2._M_allocated_capacity = *psVar14;
                    local_a0.field_2._8_8_ = puVar7[3];
                  }
                  else {
                    local_a0.field_2._M_allocated_capacity = *psVar14;
                    local_a0._M_dataplus._M_p = (pointer)*puVar7;
                  }
                  local_a0._M_string_length = puVar7[1];
                  *puVar7 = psVar14;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
                }
                else {
                  local_100 = &__str._M_string_length;
                  pcVar2 = (psVar19->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_100,pcVar2,pcVar2 + psVar19->_M_string_length);
                  std::__cxx11::string::append((char *)&local_100);
                  psVar14 = local_100;
                  _Var18 = __str._M_dataplus;
                  if (__str._M_dataplus._M_p == (pointer)psVar21->_M_string_length) {
                    if (__str._M_dataplus._M_p == (pointer)0x0) {
                      bVar23 = true;
                    }
                    else {
                      iVar5 = bcmp(local_100,(psVar21->_M_dataplus)._M_p,
                                   (size_t)__str._M_dataplus._M_p);
                      bVar23 = iVar5 == 0;
                      _Var18._M_p = (pointer)extraout_RDX_05;
                    }
                  }
                  else {
                    bVar23 = false;
                  }
                  if (psVar14 != &__str._M_string_length) {
                    operator_delete(psVar14);
                    _Var18._M_p = (pointer)extraout_RDX_06;
                  }
                  if (!bVar23) break;
                  std::operator+(&local_208,"both repeated field \"",
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)pjVar12);
                  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
                  local_130 = &local_120;
                  plVar6 = puVar7 + 2;
                  if ((long *)*puVar7 == plVar6) {
                    local_120 = *plVar6;
                    lStack_118 = puVar7[3];
                  }
                  else {
                    local_120 = *plVar6;
                    local_130 = (long *)*puVar7;
                  }
                  local_128 = puVar7[1];
                  *puVar7 = plVar6;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
                  local_150 = &local_140;
                  plVar6 = puVar7 + 2;
                  if ((long *)*puVar7 == plVar6) {
                    local_140 = *plVar6;
                    lStack_138 = puVar7[3];
                  }
                  else {
                    local_140 = *plVar6;
                    local_150 = (long *)*puVar7;
                  }
                  local_148 = puVar7[1];
                  *puVar7 = plVar6;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::_M_append((char *)&local_150,**(ulong **)this_02);
                  local_170 = &local_160;
                  plVar6 = puVar7 + 2;
                  if ((long *)*puVar7 == plVar6) {
                    local_160 = *plVar6;
                    lStack_158 = puVar7[3];
                  }
                  else {
                    local_160 = *plVar6;
                    local_170 = (long *)*puVar7;
                  }
                  local_168 = puVar7[1];
                  *puVar7 = plVar6;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
                  local_70 = (undefined1  [8])&local_60;
                  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 == paVar15) {
                    local_60._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_60._8_8_ = puVar7[3];
                  }
                  else {
                    local_60._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_70 = (undefined1  [8])*puVar7;
                  }
                  field = (FieldDescriptor *)puVar7[1];
                  *puVar7 = paVar15;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)std::__cxx11::string::append(local_70);
                  uVar22 = local_110;
                  local_50 = &local_40;
                  plVar6 = puVar7 + 2;
                  if ((long *)*puVar7 == plVar6) {
                    local_40 = *plVar6;
                    lStack_38 = puVar7[3];
                  }
                  else {
                    local_40 = *plVar6;
                    local_50 = (long *)*puVar7;
                  }
                  local_48 = puVar7[1];
                  *puVar7 = plVar6;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_50,(ulong)(psVar19->_M_dataplus)._M_p);
                  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                  psVar14 = puVar7 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar14) {
                    local_a0.field_2._M_allocated_capacity = *psVar14;
                    local_a0.field_2._8_8_ = puVar7[3];
                  }
                  else {
                    local_a0.field_2._M_allocated_capacity = *psVar14;
                    local_a0._M_dataplus._M_p = (pointer)*puVar7;
                  }
                  local_a0._M_string_length = puVar7[1];
                  *puVar7 = psVar14;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
                }
                psVar14 = (size_type *)(plVar6 + 2);
                if ((size_type *)*plVar6 == psVar14) {
                  __str._M_string_length = *psVar14;
                  __str.field_2._M_allocated_capacity = plVar6[3];
                  local_100 = &__str._M_string_length;
                }
                else {
                  __str._M_string_length = *psVar14;
                  local_100 = (size_type *)*plVar6;
                }
                __str._M_dataplus._M_p = (pointer)plVar6[1];
                *plVar6 = (long)psVar14;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::operator=((string *)this_01,(string *)&local_100);
                if (local_100 != &__str._M_string_length) {
                  operator_delete(local_100);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
                if (local_50 != &local_40) {
                  operator_delete(local_50);
                }
                if (local_70 != (undefined1  [8])&local_60) {
                  operator_delete((void *)local_70);
                }
                if (local_170 != &local_160) {
                  operator_delete(local_170);
                }
                if (local_150 != &local_140) {
                  operator_delete(local_150);
                }
                if (local_130 != &local_120) {
                  operator_delete(local_130);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != &local_208.field_2) {
                  operator_delete(local_208._M_dataplus._M_p);
                }
                local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] =
                     local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] |
                     1L << ((byte)uVar22 & 0x3f);
                local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[(ulong)pFVar20 >> 6]
                     = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(ulong)pFVar20 >> 6] | (ulong)pFVar17;
                std::__cxx11::string::_M_assign((string *)((long)local_1e8 + pFVar20 * 0x20));
                _Var18._M_p = (pointer)extraout_RDX_07;
                break;
              }
              bVar23 = true;
              pjVar3 = this_02;
              psVar4 = psVar21;
              this_02 = pjVar12;
              psVar21 = psVar19;
            } while (uVar1 == 3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
            _Var18._M_p = (pointer)extraout_RDX_08;
          }
          uVar22 = local_110 + 1;
          lVar10 = *(long *)__n;
        } while (uVar22 < (ulong)(*(long *)(__n + 8) - lVar10 >> 3));
      }
      else {
        pFVar17 = (FieldDescriptor *)(1L << ((byte)pFVar20 & 0x3f));
      }
      if ((local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(ulong)pFVar20 >> 6] & (ulong)pFVar17) != 0) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)&local_100,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_context.cc"
                   ,0x95);
        pLVar8 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)&local_100,"field \"");
        pLVar8 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           (pLVar8,*(string **)(this_00 + 8));
        pLVar8 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<(pLVar8,"\" is conflicting ");
        pLVar8 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<(pLVar8,"with another field: ");
        pLVar8 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           (pLVar8,(string *)((long)local_1e8 + pFVar20 * 0x20));
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_100);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ppFVar9 = *(pointer *)__n;
      ppFVar16 = *(pointer *)(__n + 8);
      pFVar17 = (FieldDescriptor *)((long)ppFVar16 - (long)ppFVar9 >> 3);
      local_1c0 = local_1c0 + 1;
      pFVar20 = local_210;
    } while (local_210 < pFVar17);
  }
  if (ppFVar16 != ppFVar9) {
    uVar22 = 0;
    do {
      local_70 = (undefined1  [8])ppFVar9[uVar22];
      local_100 = &__str._M_string_length;
      __str._M_dataplus._M_p = (pointer)0x0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str.field_2._8_8_ = local_d0;
      local_d0[0] = 0;
      local_c0 = local_b0;
      local_b8 = 0;
      local_b0[0] = 0;
      CamelCaseFieldName_abi_cxx11_(&local_a0,(java *)local_70,pFVar17);
      std::__cxx11::string::operator=((string *)&local_100,(string *)&local_a0);
      pFVar17 = extraout_RDX_09;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
        pFVar17 = extraout_RDX_10;
      }
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_a0,(java *)local_70,pFVar17);
      std::__cxx11::string::operator=
                ((string *)(__str.field_2._M_local_buf + 8),(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar22 >> 6 & 0x3ffffff] >> (uVar22 & 0x3f) & 1)
          != 0) {
        paVar15 = &local_a0.field_2;
        local_a0._M_dataplus._M_p = (pointer)paVar15;
        lVar10 = google::protobuf::FastInt32ToBufferLeft
                           (*(int *)((long)local_70 + 0x44),paVar15->_M_local_buf);
        local_a0._M_string_length = lVar10 - (long)paVar15;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50);
        }
        local_a0._M_dataplus._M_p = (pointer)paVar15;
        lVar10 = google::protobuf::FastInt32ToBufferLeft
                           (*(int *)((long)local_70 + 0x44),paVar15->_M_local_buf);
        local_a0._M_string_length = lVar10 - (long)paVar15;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::_M_append(__str.field_2._M_local_buf + 8,(ulong)local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50);
        }
        std::__cxx11::string::_M_assign((string *)&local_c0);
      }
      pmVar11 = std::
                map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                ::operator[](&this->field_generator_info_map_,(key_type *)local_70);
      std::__cxx11::string::_M_assign((string *)pmVar11);
      std::__cxx11::string::_M_assign((string *)&pmVar11->capitalized_name);
      std::__cxx11::string::_M_assign((string *)&pmVar11->disambiguated_reason);
      pFVar17 = extraout_RDX_11;
      if (local_c0 != local_b0) {
        operator_delete(local_c0);
        pFVar17 = extraout_RDX_12;
      }
      if ((undefined1 *)__str.field_2._8_8_ != local_d0) {
        operator_delete((void *)__str.field_2._8_8_);
        pFVar17 = extraout_RDX_13;
      }
      if (local_100 != &__str._M_string_length) {
        operator_delete(local_100);
        pFVar17 = extraout_RDX_14;
      }
      uVar22 = uVar22 + 1;
      ppFVar9 = *(pointer *)__n;
    } while (uVar22 < (ulong)(*(long *)(__n + 8) - (long)ppFVar9 >> 3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  if (local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}